

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.cxx
# Opt level: O1

bool __thiscall
cmCTestRunScriptCommand::InitialPass
          (cmCTestRunScriptCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pbVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  cmCTestRunScriptCommand *pcVar9;
  uint uVar10;
  uint __len;
  string_view value;
  int ret;
  string returnVariable;
  uint local_7c;
  cmCTestRunScriptCommand *local_78;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  string local_50;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    cmCTestScriptHandler::RunCurrentScript((this->super_cmCTestCommand).CTestScriptHandler);
  }
  else {
    local_78 = this;
    iVar1 = std::__cxx11::string::compare((char *)pbVar4);
    uVar5 = (ulong)(iVar1 == 0);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5)) {
      uVar8 = uVar5;
      do {
        uVar7 = (uint)uVar8;
        iVar2 = std::__cxx11::string::compare((char *)(pbVar4 + uVar8));
        if ((iVar2 == 0) &&
           (uVar7 = uVar7 + 1,
           (ulong)uVar7 <
           (ulong)((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5))) {
          std::__cxx11::string::_M_assign((string *)&local_50);
        }
        uVar8 = (ulong)(uVar7 + 1);
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar8 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5
                              ));
    }
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(iVar1 == 0) <
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5)) {
      pcVar9 = local_78;
      uVar8 = (ulong)(iVar1 == 0);
      do {
        iVar6 = (int)uVar5;
        iVar2 = std::__cxx11::string::compare((char *)(pbVar4 + uVar8));
        if (iVar2 == 0) {
          iVar6 = iVar6 + 1;
        }
        else {
          cmCTestScriptHandler::RunScript
                    ((pcVar9->super_cmCTestCommand).CTest,
                     (pcVar9->super_cmCTestCommand).super_cmCommand.Makefile,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar8,iVar1 != 0,(int *)&local_7c)
          ;
          uVar7 = -local_7c;
          if (0 < (int)local_7c) {
            uVar7 = local_7c;
          }
          __len = 1;
          if (9 < uVar7) {
            uVar5 = (ulong)uVar7;
            uVar10 = 4;
            do {
              __len = uVar10;
              uVar3 = (uint)uVar5;
              if (uVar3 < 100) {
                __len = __len - 2;
                goto LAB_00220afd;
              }
              if (uVar3 < 1000) {
                __len = __len - 1;
                goto LAB_00220afd;
              }
              if (uVar3 < 10000) goto LAB_00220afd;
              uVar5 = uVar5 / 10000;
              uVar10 = __len + 4;
            } while (99999 < uVar3);
            __len = __len + 1;
          }
LAB_00220afd:
          this_00 = (pcVar9->super_cmCTestCommand).super_cmCommand.Makefile;
          uVar10 = local_7c >> 0x1f;
          local_70 = local_60;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_70,(char)__len - (char)((int)local_7c >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_70 + (ulong)uVar10),__len,uVar7);
          value._M_str = (char *)local_70;
          value._M_len = local_68;
          cmMakefile::AddDefinition(this_00,&local_50,value);
          pcVar9 = local_78;
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
        uVar5 = (ulong)(iVar6 + 1);
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar8 = uVar5;
      } while (uVar5 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5
                              ));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  return true;
}

Assistant:

bool cmCTestRunScriptCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->CTestScriptHandler->RunCurrentScript();
    return true;
  }

  bool np = false;
  unsigned int i = 0;
  if (args[i] == "NEW_PROCESS") {
    np = true;
    i++;
  }
  int start = i;
  // run each script
  std::string returnVariable;
  for (i = start; i < args.size(); ++i) {
    if (args[i] == "RETURN_VALUE") {
      ++i;
      if (i < args.size()) {
        returnVariable = args[i];
      }
    }
  }
  for (i = start; i < args.size(); ++i) {
    if (args[i] == "RETURN_VALUE") {
      ++i;
    } else {
      int ret;
      cmCTestScriptHandler::RunScript(this->CTest, this->Makefile, args[i],
                                      !np, &ret);
      this->Makefile->AddDefinition(returnVariable, std::to_string(ret));
    }
  }
  return true;
}